

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_ecdsa_sig_verify
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message)

{
  int iVar1;
  secp256k1_gej pr;
  secp256k1_gej pubkeyj;
  secp256k1_fe xr;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  uchar c [32];
  secp256k1_scalar *in_stack_000006e8;
  secp256k1_scalar *in_stack_000006f0;
  secp256k1_gej *in_stack_000006f8;
  secp256k1_gej *in_stack_00000700;
  secp256k1_ge *in_stack_fffffffffffffdf8;
  secp256k1_gej *in_stack_fffffffffffffe00;
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_fe *in_stack_fffffffffffffe30;
  secp256k1_scalar *in_stack_fffffffffffffe38;
  secp256k1_scalar *in_stack_fffffffffffffe40;
  
  iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x103884);
  if ((iVar1 != 0) || (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x103896), iVar1 != 0))
  {
    return 0;
  }
  secp256k1_scalar_inverse_var
            ((secp256k1_scalar *)in_stack_fffffffffffffe30,
             (secp256k1_scalar *)in_stack_fffffffffffffe28);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (secp256k1_scalar *)in_stack_fffffffffffffe30);
  secp256k1_scalar_mul
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
             (secp256k1_scalar *)in_stack_fffffffffffffe30);
  secp256k1_gej_set_ge(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  secp256k1_ecmult(in_stack_00000700,in_stack_000006f8,in_stack_000006f0,in_stack_000006e8);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x103937);
  if (iVar1 != 0) {
    return 0;
  }
  secp256k1_scalar_get_b32
            ((uchar *)in_stack_fffffffffffffe00,(secp256k1_scalar *)in_stack_fffffffffffffdf8);
  secp256k1_fe_set_b32_limit(&in_stack_fffffffffffffdf8->x,(uchar *)0x103976);
  iVar1 = secp256k1_gej_eq_x_var(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = secp256k1_fe_cmp_var(&in_stack_fffffffffffffe00->x,&in_stack_fffffffffffffdf8->x);
  if (-1 < iVar1) {
    return 0;
  }
  secp256k1_fe_add(&in_stack_fffffffffffffe00->x,&in_stack_fffffffffffffdf8->x);
  iVar1 = secp256k1_gej_eq_x_var(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (iVar1 != 0) {
    return 1;
  }
  return 0;
}

Assistant:

static int secp256k1_ecdsa_sig_verify(const secp256k1_scalar *sigr, const secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    unsigned char c[32];
    secp256k1_scalar sn, u1, u2;
#if !defined(EXHAUSTIVE_TEST_ORDER)
    secp256k1_fe xr;
#endif
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);
    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }

#if defined(EXHAUSTIVE_TEST_ORDER)
{
    secp256k1_scalar computed_r;
    secp256k1_ge pr_ge;
    secp256k1_ge_set_gej(&pr_ge, &pr);
    secp256k1_fe_normalize(&pr_ge.x);

    secp256k1_fe_get_b32(c, &pr_ge.x);
    secp256k1_scalar_set_b32(&computed_r, c, NULL);
    return secp256k1_scalar_eq(sigr, &computed_r);
}
#else
    secp256k1_scalar_get_b32(c, sigr);
    /* we can ignore the fe_set_b32_limit return value, because we know the input is in range */
    (void)secp256k1_fe_set_b32_limit(&xr, c);

    /** We now have the recomputed R point in pr, and its claimed x coordinate (modulo n)
     *  in xr. Naively, we would extract the x coordinate from pr (requiring a inversion modulo p),
     *  compute the remainder modulo n, and compare it to xr. However:
     *
     *        xr == X(pr) mod n
     *    <=> exists h. (xr + h * n < p && xr + h * n == X(pr))
     *    [Since 2 * n > p, h can only be 0 or 1]
     *    <=> (xr == X(pr)) || (xr + n < p && xr + n == X(pr))
     *    [In Jacobian coordinates, X(pr) is pr.x / pr.z^2 mod p]
     *    <=> (xr == pr.x / pr.z^2 mod p) || (xr + n < p && xr + n == pr.x / pr.z^2 mod p)
     *    [Multiplying both sides of the equations by pr.z^2 mod p]
     *    <=> (xr * pr.z^2 mod p == pr.x) || (xr + n < p && (xr + n) * pr.z^2 mod p == pr.x)
     *
     *  Thus, we can avoid the inversion, but we have to check both cases separately.
     *  secp256k1_gej_eq_x implements the (xr * pr.z^2 mod p == pr.x) test.
     */
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* xr * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    if (secp256k1_fe_cmp_var(&xr, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
        /* xr + n >= p, so we can skip testing the second case. */
        return 0;
    }
    secp256k1_fe_add(&xr, &secp256k1_ecdsa_const_order_as_fe);
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* (xr + n) * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    return 0;
#endif
}